

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_decode_memory
               (uchar **out,uint *w,uint *h,uchar *in,size_t insize,LodePNGColorType colortype,
               uint bitdepth)

{
  uint uVar1;
  LodePNGState local_230;
  
  local_230._vptr_LodePNGState = (_func_int **)&PTR__LodePNGState_00119c88;
  lodepng_state_init(&local_230);
  local_230.info_raw.bitdepth = bitdepth;
  local_230.info_raw.colortype = colortype;
  uVar1 = lodepng_decode(out,w,h,&local_230,in,insize);
  lodepng_state_cleanup(&local_230);
  return uVar1;
}

Assistant:

unsigned lodepng_decode_memory(unsigned char** out, unsigned* w, unsigned* h, const unsigned char* in,
                               size_t insize, LodePNGColorType colortype, unsigned bitdepth)
{
  unsigned error;
  LodePNGState state;
  lodepng_state_init(&state);
  state.info_raw.colortype = colortype;
  state.info_raw.bitdepth = bitdepth;
  error = lodepng_decode(out, w, h, &state, in, insize);
  lodepng_state_cleanup(&state);
  return error;
}